

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
mxx::scatterv<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,
                  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,size_t recv_size,
                  int root,comm *comm)

{
  allocator_type local_31;
  
  if ((comm->m_rank == root) &&
     ((long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)comm->m_size)) {
    assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0x170,"scatterv");
  }
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,recv_size,&local_31);
  scatterv<int>(msgs,sizes,
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start,recv_size,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatterv(const T* msgs, const std::vector<size_t>& sizes, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    std::vector<T> result(recv_size);
    scatterv(msgs, sizes, &result[0], recv_size, root, comm);
    return result;
}